

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::DotProductLayerParams::ByteSizeLong(DotProductLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  DotProductLayerParams *this_local;
  
  sStack_18 = 0;
  bVar1 = cosinesimilarity(this);
  if (bVar1) {
    sStack_18 = 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t DotProductLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DotProductLayerParams)
  size_t total_size = 0;

  // bool cosineSimilarity = 1;
  if (this->cosinesimilarity() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}